

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  int out_n;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  stbi_uc sVar7;
  int iVar8;
  stbi__uint32 sVar9;
  stbi__uint32 sVar10;
  uint depth;
  uint color;
  uint uVar11;
  uint uVar12;
  int iVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  uint uVar16;
  ulong uVar17;
  stbi_uc *psVar18;
  uint uVar19;
  uint uVar20;
  stbi__png *psVar21;
  stbi__png *psVar22;
  uint uVar23;
  long lVar24;
  ushort uVar25;
  uint uVar26;
  size_t sVar27;
  uint y_00;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  stbi_uc tc [3];
  stbi__uint32 raw_len;
  stbi__png *local_450;
  long local_448;
  stbi_uc *local_440;
  stbi_uc palette [1024];
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar8 = stbi__check_png_header(s);
  if (iVar8 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar30 = true;
  bVar5 = 0;
  color = 0;
  depth = 0;
  bVar3 = false;
  uVar12 = 0;
  uVar11 = 0;
  uVar23 = 0;
  bVar4 = false;
  psVar21 = z;
  psVar22 = (stbi__png *)0x0;
  do {
    sVar9 = stbi__get32be(s);
    uVar17 = (ulong)sVar9;
    sVar10 = stbi__get32be(s);
    if (sVar10 == 0x43674249) {
      bVar3 = true;
LAB_0011049d:
      stbi__skip(s,sVar9);
    }
    else if (sVar10 == 0x49444154) {
      if (bVar30) goto LAB_001106c5;
      if (((char)psVar22 != '\0') && (uVar12 == 0)) {
        stbi__g_failure_reason = "no PLTE";
        return 0;
      }
      if (scan == 2) {
        s->img_n = (uint)psVar22 & 0xff;
        return 1;
      }
      uVar19 = uVar23 + sVar9;
      if ((int)uVar19 < (int)uVar23) {
        return 0;
      }
      if (uVar11 < uVar19) {
        if (sVar9 < 0x1001) {
          uVar17 = 0x1000;
        }
        if (uVar11 != 0) {
          uVar17 = (ulong)uVar11;
        }
        do {
          sVar27 = uVar17;
          uVar11 = (uint)sVar27;
          uVar17 = (ulong)(uVar11 * 2);
        } while (uVar11 < uVar19);
        psVar14 = (stbi_uc *)realloc(*ppsVar1,sVar27);
        if (psVar14 == (stbi_uc *)0x0) goto LAB_00110c87;
        *ppsVar1 = psVar14;
      }
      else {
        psVar14 = *ppsVar1;
      }
      iVar8 = stbi__getn(s,psVar14 + uVar23,sVar9);
      if (iVar8 == 0) {
        stbi__g_failure_reason = "outofdata";
        return 0;
      }
      bVar30 = false;
      uVar23 = uVar19;
    }
    else if (sVar10 == 0x49484452) {
      if (!bVar30) {
        stbi__g_failure_reason = "multiple IHDR";
        return 0;
      }
      if (sVar9 != 0xd) {
        stbi__g_failure_reason = "bad IHDR len";
        return 0;
      }
      sVar9 = stbi__get32be(s);
      s->img_x = sVar9;
      if (0x1000000 < sVar9) {
LAB_00110698:
        stbi__g_failure_reason = "too large";
        return 0;
      }
      sVar9 = stbi__get32be(s);
      s->img_y = sVar9;
      if (0x1000000 < sVar9) goto LAB_00110698;
      bVar5 = stbi__get8(s);
      if ((8 < bVar5) || (depth = (uint)bVar5, (0x116U >> (bVar5 & 0x1f) & 1) == 0)) {
        stbi__g_failure_reason = "1/2/4/8-bit only";
        return 0;
      }
      bVar6 = stbi__get8(s);
      if (6 < bVar6) {
LAB_001106b3:
        stbi__g_failure_reason = "bad ctype";
        return 0;
      }
      color = (uint)bVar6;
      psVar21 = (stbi__png *)CONCAT71((int7)((ulong)psVar21 >> 8),3);
      if ((bVar6 != 3) && (psVar21 = psVar22, (bVar6 & 1) != 0)) goto LAB_001106b3;
      psVar22 = psVar21;
      sVar7 = stbi__get8(s);
      if (sVar7 != '\0') {
        stbi__g_failure_reason = "bad comp method";
        return 0;
      }
      sVar7 = stbi__get8(s);
      if (sVar7 != '\0') {
        stbi__g_failure_reason = "bad filter method";
        return 0;
      }
      bVar5 = stbi__get8(s);
      if (1 < bVar5) {
        stbi__g_failure_reason = "bad interlace method";
        return 0;
      }
      uVar19 = s->img_x;
      if ((uVar19 == 0) || (uVar16 = s->img_y, uVar16 == 0)) {
        stbi__g_failure_reason = "0-pixel image";
        return 0;
      }
      if ((char)psVar22 == '\0') {
        uVar20 = (uint)(3 < bVar6) + (bVar6 & 2) + 1;
        s->img_n = uVar20;
        if ((uint)((0x40000000 / (ulong)uVar19) / (ulong)uVar20) < uVar16) goto LAB_00110698;
        bVar30 = false;
        psVar22 = (stbi__png *)0x0;
        if (scan == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar30 = false;
        if ((uint)(0x40000000 / (ulong)uVar19 >> 2) < uVar16) goto LAB_00110698;
      }
    }
    else if (sVar10 == 0x504c5445) {
      if (bVar30) goto LAB_001106c5;
      if ((0x300 < sVar9) || (uVar12 = (sVar9 & 0xffff) / 3, uVar12 * 3 != sVar9)) {
        stbi__g_failure_reason = "invalid PLTE";
        return 0;
      }
      for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
        sVar7 = stbi__get8(s);
        palette[uVar17 * 4] = sVar7;
        sVar7 = stbi__get8(s);
        palette[uVar17 * 4 + 1] = sVar7;
        sVar7 = stbi__get8(s);
        palette[uVar17 * 4 + 2] = sVar7;
        palette[uVar17 * 4 + 3] = 0xff;
      }
      bVar30 = false;
    }
    else {
      if (sVar10 != 0x74524e53) {
        if (sVar10 != 0x49454e44) {
          if (bVar30) goto LAB_001106c5;
          bVar30 = false;
          if ((sVar10 >> 0x1d & 1) == 0) {
            uVar12 = sVar10 >> 0x18 | (sVar10 & 0xff0000) >> 8 | (sVar10 & 0xff00) << 8 |
                     sVar10 << 0x18;
            stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
            stbi__parse_png_file::invalid_chunk[0] = (char)uVar12;
            stbi__parse_png_file::invalid_chunk[1] = (char)(uVar12 >> 8);
            stbi__parse_png_file::invalid_chunk[2] = (char)(uVar12 >> 0x10);
            stbi__parse_png_file::invalid_chunk[3] = (char)(uVar12 >> 0x18);
            return 0;
          }
          goto LAB_0011049d;
        }
        if (bVar30) {
LAB_001106c5:
          stbi__g_failure_reason = "first not IHDR";
          return 0;
        }
        if (scan != 0) {
          return 1;
        }
        if (*ppsVar1 == (stbi_uc *)0x0) {
          stbi__g_failure_reason = "no IDAT";
          return 0;
        }
        raw_len = s->img_n * s->img_y * (s->img_x * depth + 7 >> 3) + s->img_y;
        local_450 = psVar22;
        psVar14 = (stbi_uc *)
                  stbi_zlib_decode_malloc_guesssize_headerflag
                            ((char *)*ppsVar1,uVar23,raw_len,(int *)&raw_len,(uint)!bVar3);
        z->expanded = psVar14;
        if (psVar14 == (stbi_uc *)0x0) {
          return 0;
        }
        free(z->idata);
        sVar9 = raw_len;
        z->idata = (stbi_uc *)0x0;
        iVar8 = s->img_n + 1;
        iVar13 = s->img_n;
        if (bVar4) {
          iVar13 = iVar8;
        }
        out_n = iVar13;
        if (req_comp != 3) {
          out_n = iVar8;
        }
        if ((char)local_450 != '\0') {
          out_n = iVar13;
        }
        if (iVar8 != req_comp) {
          out_n = iVar13;
        }
        s->img_out_n = out_n;
        psVar14 = z->expanded;
        sVar10 = z->s->img_x;
        y = z->s->img_y;
        if (bVar5 == 0) {
          iVar8 = stbi__create_png_image_raw(z,psVar14,raw_len,out_n,sVar10,y,depth,color);
          if (iVar8 == 0) {
            return 0;
          }
        }
        else {
          psVar15 = (stbi_uc *)malloc((ulong)(sVar10 * out_n * y));
          sVar27 = (size_t)out_n;
          for (lVar29 = 0; lVar29 != 7; lVar29 = lVar29 + 1) {
            psVar2 = z->s;
            uVar12 = (&DAT_00115590)[lVar29];
            uVar23 = (&DAT_001155d0)[lVar29];
            uVar26 = ~uVar12 + psVar2->img_x + uVar23;
            uVar20 = uVar26 / uVar23;
            uVar11 = (&DAT_001155b0)[lVar29];
            uVar19 = (&DAT_001155f0)[lVar29];
            uVar16 = ~uVar11 + psVar2->img_y + uVar19;
            y_00 = uVar16 / uVar19;
            if ((uVar23 <= uVar26) && (uVar19 <= uVar16)) {
              iVar8 = psVar2->img_n;
              local_448 = lVar29;
              local_440 = psVar14;
              iVar13 = stbi__create_png_image_raw(z,psVar14,sVar9,out_n,uVar20,y_00,depth,color);
              if (iVar13 == 0) {
                free(psVar15);
                return 0;
              }
              uVar16 = (((int)(uVar20 * depth * iVar8 + 7) >> 3) + 1) * y_00;
              iVar8 = uVar11 * out_n;
              for (lVar29 = 0; lVar29 < (int)y_00; lVar29 = lVar29 + 1) {
                psVar14 = psVar15 + (long)(int)uVar12 * sVar27;
                for (lVar24 = 0; lVar24 < (int)uVar20; lVar24 = lVar24 + 1) {
                  memcpy(psVar14 + z->s->img_x * iVar8,
                         z->out + (lVar29 * (int)uVar20 + lVar24) * sVar27,sVar27);
                  psVar14 = psVar14 + (long)(int)uVar23 * sVar27;
                }
                iVar8 = iVar8 + uVar19 * out_n;
              }
              free(z->out);
              psVar14 = local_440 + uVar16;
              sVar9 = sVar9 - uVar16;
              lVar29 = local_448;
            }
          }
          z->out = psVar15;
        }
        if (bVar4) {
          iVar8 = z->s->img_y * z->s->img_x;
          psVar14 = z->out;
          if (s->img_out_n == 2) {
            for (lVar29 = 0; iVar8 != (int)lVar29; lVar29 = lVar29 + 1) {
              psVar14[lVar29 * 2 + 1] = -(psVar14[lVar29 * 2] != tc[0]);
            }
          }
          else {
            for (lVar29 = 0; iVar8 != (int)lVar29; lVar29 = lVar29 + 1) {
              if (((psVar14[lVar29 * 4] == tc[0]) && (psVar14[lVar29 * 4 + 1] == tc[1])) &&
                 (psVar14[lVar29 * 4 + 2] == tc[2])) {
                psVar14[lVar29 * 4 + 3] = '\0';
              }
            }
          }
        }
        if (((bVar3) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
          psVar2 = z->s;
          psVar14 = z->out;
          iVar8 = psVar2->img_y * psVar2->img_x;
          if (psVar2->img_out_n == 3) {
            while (bVar30 = iVar8 != 0, iVar8 = iVar8 + -1, bVar30) {
              sVar7 = *psVar14;
              *psVar14 = psVar14[2];
              psVar14[2] = sVar7;
              psVar14 = psVar14 + 3;
            }
          }
          else if (stbi__unpremultiply_on_load == 0) {
            for (lVar29 = 0; iVar8 != (int)lVar29; lVar29 = lVar29 + 1) {
              sVar7 = psVar14[lVar29 * 4];
              psVar14[lVar29 * 4] = psVar14[lVar29 * 4 + 2];
              psVar14[lVar29 * 4 + 2] = sVar7;
            }
          }
          else {
            for (lVar29 = 0; iVar8 != (int)lVar29; lVar29 = lVar29 + 1) {
              bVar5 = psVar14[lVar29 * 4];
              bVar6 = psVar14[lVar29 * 4 + 2];
              if (psVar14[lVar29 * 4 + 3] != 0) {
                uVar25 = (ushort)psVar14[lVar29 * 4 + 3];
                bVar6 = (byte)(((uint)bVar6 * 0xff) / (uint)uVar25);
                psVar14[lVar29 * 4 + 1] =
                     (stbi_uc)(((uint)psVar14[lVar29 * 4 + 1] * 0xff) / (uint)uVar25);
                bVar5 = (byte)((ushort)((ushort)bVar5 * 0xff) / uVar25);
              }
              psVar14[lVar29 * 4] = bVar6;
              psVar14[lVar29 * 4 + 2] = bVar5;
            }
          }
        }
        if ((char)local_450 != '\0') {
          uVar12 = (uint)local_450 & 0xff;
          s->img_n = uVar12;
          if (2 < req_comp) {
            uVar12 = req_comp;
          }
          s->img_out_n = uVar12;
          psVar14 = z->out;
          uVar23 = z->s->img_y * z->s->img_x;
          psVar15 = (stbi_uc *)malloc((ulong)(uVar23 * uVar12));
          if (psVar15 == (stbi_uc *)0x0) {
LAB_00110c87:
            stbi__g_failure_reason = "outofmem";
            return 0;
          }
          uVar17 = 0;
          psVar18 = psVar15;
          if (uVar12 == 3) {
            for (; uVar23 != uVar17; uVar17 = uVar17 + 1) {
              uVar28 = (ulong)psVar14[uVar17];
              *psVar18 = palette[uVar28 * 4];
              psVar18[1] = palette[uVar28 * 4 + 1];
              psVar18[2] = palette[uVar28 * 4 + 2];
              psVar18 = psVar18 + 3;
            }
          }
          else {
            for (; uVar23 != uVar17; uVar17 = uVar17 + 1) {
              *(undefined4 *)(psVar15 + uVar17 * 4) =
                   *(undefined4 *)(palette + (ulong)psVar14[uVar17] * 4);
            }
          }
          free(psVar14);
          z->out = psVar15;
        }
        free(z->expanded);
        z->expanded = (stbi_uc *)0x0;
        return 1;
      }
      if (bVar30) goto LAB_001106c5;
      if (*ppsVar1 != (stbi_uc *)0x0) {
        stbi__g_failure_reason = "tRNS after IDAT";
        return 0;
      }
      if ((char)psVar22 == '\0') {
        uVar19 = s->img_n;
        if ((uVar19 & 1) == 0) {
          stbi__g_failure_reason = "tRNS with alpha";
          return 0;
        }
        if (uVar19 * 2 != sVar9) goto LAB_00110734;
        for (lVar29 = 0; lVar29 < (int)uVar19; lVar29 = lVar29 + 1) {
          iVar8 = stbi__get16be(s);
          tc[lVar29] = ""[depth] * (char)iVar8;
          uVar19 = s->img_n;
        }
        bVar4 = true;
        bVar30 = false;
        psVar22 = (stbi__png *)0x0;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if (uVar12 == 0) {
          stbi__g_failure_reason = "tRNS before PLTE";
          return 0;
        }
        if (uVar12 < sVar9) {
LAB_00110734:
          stbi__g_failure_reason = "bad tRNS len";
          return 0;
        }
        for (uVar28 = 0; uVar17 != uVar28; uVar28 = uVar28 + 1) {
          sVar7 = stbi__get8(s);
          palette[uVar28 * 4 + 3] = sVar7;
        }
        psVar22 = (stbi__png *)CONCAT71((uint7)(uint3)(sVar9 >> 8),4);
        bVar30 = false;
      }
    }
    stbi__get32be(s);
    psVar21 = psVar22;
    psVar22 = (stbi__png *)((ulong)psVar22 & 0xffffffff);
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, depth=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            depth = stbi__get8(s);  if (depth != 1 && depth != 2 && depth != 4 && depth != 8)  return stbi__err("1/2/4/8-bit only","PNG not supported: 1/2/4/8-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (stbi_uc) (stbi__get16be(s) & 255) * stbi__depth_scale_table[depth]; // non 8-bit images will be larger
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (stbi_uc *) STBI_REALLOC(z->idata, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, depth, color, interlace)) return 0;
            if (has_trans)
               if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}